

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall
Parser::Parser(Parser *this,ofstream *out_file,Tokenizer *tokenizer,VM_Writer *vm_writer)

{
  long lVar1;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  __l;
  allocator_type local_e2;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_e1;
  int local_e0 [4];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_80;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_58;
  
  this->out_file = out_file;
  this->tokenizer = tokenizer;
  (this->cur_token)._M_dataplus._M_p = (pointer)&(this->cur_token).field_2;
  (this->cur_token)._M_string_length = 0;
  (this->cur_token).field_2._M_local_buf[0] = '\0';
  (this->prev_token)._M_dataplus._M_p = (pointer)&(this->prev_token).field_2;
  (this->prev_token)._M_string_length = 0;
  (this->prev_token).field_2._M_local_buf[0] = '\0';
  (this->class_name)._M_dataplus._M_p = (pointer)&(this->class_name).field_2;
  (this->class_name)._M_string_length = 0;
  (this->class_name).field_2._M_local_buf[0] = '\0';
  Symbol_Table::Symbol_Table(&this->symbol_table);
  this->vm_writer = vm_writer;
  (this->cur_subroutine_type)._M_dataplus._M_p = (pointer)&(this->cur_subroutine_type).field_2;
  (this->cur_subroutine_type)._M_string_length = 0;
  (this->cur_subroutine_type).field_2._M_local_buf[0] = '\0';
  local_e0[3] = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[5],_int,_true>(&local_d0,(char (*) [5])"true",local_e0 + 3);
  local_e0[2] = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[6],_int,_true>(&local_a8,(char (*) [6])"false",local_e0 + 2);
  local_e0[1] = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[5],_int,_true>(&local_80,(char (*) [5])"null",local_e0 + 1);
  local_e0[0] = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[5],_int,_true>(&local_58,(char (*) [5])"this",local_e0);
  __l._M_len = 4;
  __l._M_array = &local_d0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map(&this->keyword_constant_map,__l,&local_e1,&local_e2);
  lVar1 = 0x78;
  do {
    std::__cxx11::string::~string((string *)((long)&local_d0.first._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x28);
  query_tokenizer(this);
  parse_class(this);
  return;
}

Assistant:

Parser(std::ofstream& out_file, Tokenizer& tokenizer, VM_Writer& vm_writer): out_file(out_file),
            tokenizer(tokenizer), vm_writer(vm_writer)
    {
        query_tokenizer();
        parse_class();
    }